

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImAtoi<long_long>(char *src,longlong *output)

{
  char cVar1;
  undefined7 in_register_00000001;
  char *pcVar2;
  long lVar3;
  long lVar4;
  
  cVar1 = *src;
  lVar4 = 0;
  for (pcVar2 = src + (ulong)(src[cVar1 == '-'] == '+') + (ulong)(cVar1 == '-');
      (byte)(*pcVar2 - 0x30U) < 10; pcVar2 = pcVar2 + 1) {
    lVar4 = (ulong)(byte)(*pcVar2 - 0x30U) + lVar4 * 10;
  }
  lVar3 = -lVar4;
  if (cVar1 != '-') {
    lVar3 = lVar4;
  }
  *output = lVar3;
  return (char *)CONCAT71(in_register_00000001,cVar1);
}

Assistant:

static const char* ImAtoi(const char* src, TYPE* output)
{
    int negative = 0;
    if (*src == '-') { negative = 1; src++; }
    if (*src == '+') { src++; }
    TYPE v = 0;
    while (*src >= '0' && *src <= '9')
        v = (v * 10) + (*src++ - '0');
    *output = negative ? -v : v;
    return src;
}